

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:2107:13)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:2107:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<unsigned_long>_> *pEVar1;
  unsigned_long *in;
  Promise<unsigned_long> local_548;
  ExceptionOr<kj::Promise<unsigned_long>_> local_540;
  unsigned_long *local_398;
  unsigned_long *depValue;
  unsigned_long *_depValue779;
  Exception *local_1e0;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c0 [8];
  ExceptionOr<unsigned_long> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:2107:13)>
  *this_local;
  
  depResult.value.ptr.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)output;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)local_1c0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<unsigned_long>
                         ((Maybe<unsigned_long> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (unsigned_long *)0x0) {
      local_398 = depValue;
      in = mv<unsigned_long>(depValue);
      MaybeVoidCaller<unsigned_long,kj::Promise<unsigned_long>>::
      apply<kj::(anonymous_namespace)::TestCase2100::run()::__0>
                ((MaybeVoidCaller<unsigned_long,kj::Promise<unsigned_long>> *)&local_548,&this->func
                 ,in);
      TransformPromiseNodeBase::handle<kj::Promise<unsigned_long>>
                (&local_540,&this->super_TransformPromiseNodeBase,&local_548);
      pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1);
      ExceptionOr<kj::Promise<unsigned_long>_>::operator=(pEVar1,&local_540);
      ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr(&local_540);
      Promise<unsigned_long>::~Promise(&local_548);
    }
  }
  else {
    local_1e0 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<unsigned_long>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<unsigned_long>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1);
    ExceptionOr<kj::Promise<unsigned_long>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
    ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<unsigned_long>_> *)&_depValue779);
  }
  ExceptionOr<unsigned_long>::~ExceptionOr((ExceptionOr<unsigned_long> *)local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }